

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::setRep(SPxBasisBase<double> *this)

{
  Representation RVar1;
  long in_RDI;
  SPxBasisBase<double> *in_stack_00000020;
  
  reDim(in_stack_00000020);
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  RVar1 = SPxSolverBase<double>::rep(*(SPxSolverBase<double> **)(in_RDI + 8));
  if (RVar1 == ROW) {
    *(long *)(in_RDI + 0x100) = in_RDI + 0xd0;
    *(long *)(in_RDI + 0x108) = in_RDI + 0xe8;
  }
  else {
    *(long *)(in_RDI + 0x100) = in_RDI + 0xe8;
    *(long *)(in_RDI + 0x108) = in_RDI + 0xd0;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::setRep()
{
   assert(theLP != nullptr);

   reDim();
   minStab = 0.0;

   if(theLP->rep() == SPxSolverBase<R>::ROW)
   {
      thedesc.stat   = &thedesc.rowstat;
      thedesc.costat = &thedesc.colstat;
   }
   else
   {
      thedesc.stat   = &thedesc.colstat;
      thedesc.costat = &thedesc.rowstat;
   }
}